

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O0

string * __thiscall
soul::IdentifierPath::toString_abi_cxx11_(string *__return_storage_ptr__,IdentifierPath *this)

{
  string *in_RCX;
  allocator<char> local_39;
  IdentifierPath *local_18;
  IdentifierPath *this_local;
  
  local_18 = this;
  this_local = (IdentifierPath *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xffffffffffffffc8,"::",&local_39);
  joinStrings<soul::ArrayWithPreallocation<soul::Identifier,8ul>>
            (__return_storage_ptr__,(soul *)this,
             (ArrayWithPreallocation<soul::Identifier,_8UL> *)&stack0xffffffffffffffc8,in_RCX);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const
    {
        return joinStrings (pathSections, "::");
    }